

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O0

void nn_priolist_rm(nn_priolist *self,nn_priolist_data *data)

{
  int iVar1;
  nn_list *self_00;
  nn_list_item *pnVar2;
  nn_list_item *in_RSI;
  long in_RDI;
  nn_list_item *it;
  nn_priolist_slot *slot;
  nn_list_item *in_stack_ffffffffffffffc8;
  nn_list *in_stack_ffffffffffffffd0;
  nn_list_item *local_28;
  
  iVar1 = nn_list_item_isinlist(in_RSI + 1);
  if (iVar1 == 0) {
    nn_list_item_term((nn_list_item *)0x148aff);
  }
  else {
    self_00 = (nn_list *)(in_RDI + (long)(*(int *)&in_RSI->prev + -1) * 0x18);
    if (self_00[1].first == in_RSI) {
      local_28 = nn_list_erase(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (local_28 == (nn_list_item *)0x0) {
        local_28 = (nn_list_item *)0x0;
      }
      else {
        local_28 = local_28 + -1;
      }
      self_00[1].first = local_28;
      nn_list_item_term((nn_list_item *)0x148bae);
      if (self_00[1].first == (nn_list_item *)0x0) {
        pnVar2 = nn_list_begin(self_00);
        if (pnVar2 == (nn_list_item *)0x0) {
          pnVar2 = (nn_list_item *)0x0;
        }
        else {
          pnVar2 = pnVar2 + -1;
        }
        self_00[1].first = pnVar2;
      }
      if (*(int *)(in_RDI + 0x180) == *(int *)&in_RSI->prev) {
        do {
          iVar1 = nn_list_empty((nn_list *)(in_RDI + (long)(*(int *)(in_RDI + 0x180) + -1) * 0x18));
          if (iVar1 == 0) {
            return;
          }
          *(int *)(in_RDI + 0x180) = *(int *)(in_RDI + 0x180) + 1;
        } while (*(int *)(in_RDI + 0x180) < 0x11);
        *(undefined4 *)(in_RDI + 0x180) = 0xffffffff;
      }
    }
    else {
      nn_list_erase(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      nn_list_item_term((nn_list_item *)0x148b54);
    }
  }
  return;
}

Assistant:

void nn_priolist_rm (struct nn_priolist *self, struct nn_priolist_data *data)
{
    struct nn_priolist_slot *slot;
    struct nn_list_item *it;

    /*  Non-active pipes don't need any special processing. */
    if (!nn_list_item_isinlist (&data->item)) {
        nn_list_item_term (&data->item);
        return;
    }

    /*  If the pipe being removed is not current, we can simply erase it
        from the list. */
    slot = &self->slots [data->priority - 1];
    if (slot->current != data) {
        nn_list_erase (&slot->pipes, &data->item);
        nn_list_item_term (&data->item);
        return;
    }

    /*  Advance the current pointer (with wrap-over). */
    it = nn_list_erase (&slot->pipes, &data->item);
    slot->current = nn_cont (it, struct nn_priolist_data, item);
    nn_list_item_term (&data->item);
    if (!slot->current) {
        it = nn_list_begin (&slot->pipes);
        slot->current = nn_cont (it, struct nn_priolist_data, item);
    }

    /*  If we are not messing with the current slot, we are done. */
    if (self->current != data->priority)
        return;

    /*  Otherwise, the current slot may have become empty and we have switch
        to lower priority slots. */
    while (nn_list_empty (&self->slots [self->current - 1].pipes)) {
        ++self->current;
        if (self->current > NN_PRIOLIST_SLOTS) {
            self->current = -1;
            return;
        }
    }
}